

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

const_iterator __thiscall
cppjieba::HMMSegment::NumbersRule(HMMSegment *this,const_iterator begin,const_iterator end)

{
  uint uVar1;
  Rune x;
  const_iterator end_local;
  const_iterator begin_local;
  HMMSegment *this_local;
  const_iterator local_8;
  
  local_8 = begin;
  if ((0x2f < begin->rune) && (begin->rune < 0x3a)) {
    for (begin_local = begin + 1;
        (begin_local != end &&
        (((uVar1 = begin_local->rune, 0x2f < uVar1 && (uVar1 < 0x3a)) || (uVar1 == 0x2e))));
        begin_local = begin_local + 1) {
    }
    local_8 = begin_local;
  }
  return local_8;
}

Assistant:

RuneStrArray::const_iterator NumbersRule(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end) const {
    Rune x = begin->rune;
    if ('0' <= x && x <= '9') {
      begin ++;
    } else {
      return begin;
    }
    while (begin != end) {
      x = begin->rune;
      if ( ('0' <= x && x <= '9') || x == '.') {
        begin++;
      } else {
        break;
      }
    }
    return begin;
  }